

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O3

int __thiscall Player::reinforce(Player *this)

{
  pointer *ppCVar1;
  string *psVar2;
  pointer pcVar3;
  vector<CardType,_std::allocator<CardType>_> *pvVar4;
  pointer pCVar5;
  Hand *hand;
  Deck *deck;
  vector<Map::Continent_*,_std::allocator<Map::Continent_*>_> *pvVar6;
  pointer ppCVar7;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar8;
  Country *pCVar9;
  int iVar10;
  int iVar11;
  PlayerState *pPVar12;
  pointer ppCVar13;
  ostream *poVar14;
  size_t sVar15;
  GameLoop *pGVar16;
  pointer ppCVar17;
  long *plVar18;
  uint uVar19;
  pointer ppCVar20;
  ulong uVar21;
  int iVar22;
  int iVar23;
  char *__s;
  const_iterator __begin1;
  pointer pCVar24;
  CardType CVar25;
  int iVar26;
  uint uVar27;
  bool bVar28;
  vector<CardType,_std::allocator<CardType>_> local_98;
  pointer local_70;
  int local_64;
  pointer local_60;
  CardType local_58;
  int local_54 [3];
  vector<CardType,_std::allocator<CardType>_> local_48;
  
  operator_delete(this->currentState,4);
  pPVar12 = (PlayerState *)operator_new(4);
  *pPVar12 = REINFORCING;
  this->currentState = pPVar12;
  notifyAll(this);
  psVar2 = this->strategy->strategyName;
  ppCVar1 = &local_98.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  pcVar3 = (psVar2->_M_dataplus)._M_p;
  local_98.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)ppCVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,pcVar3,pcVar3 + psVar2->_M_string_length);
  iVar10 = std::__cxx11::string::compare((char *)&local_98);
  if ((pointer *)
      local_98.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl.
      super__Vector_impl_data._M_start != ppCVar1) {
    operator_delete(local_98.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)local_98.super__Vector_base<CardType,_std::allocator<CardType>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
  }
  if (iVar10 == 0) {
    iVar10 = (**this->strategy->_vptr_PlayerStrategy)(this->strategy,10);
    return (int)(char)iVar10;
  }
  iVar10 = 0;
LAB_0010d436:
  pvVar4 = this->pCards->handPointer;
  pCVar24 = (pvVar4->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pCVar5 = (pvVar4->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (0x14 < (ulong)((long)pCVar5 - (long)pCVar24)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "You have more than 5 cards in your hand, so you must exchange at least once",0x4b);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
    std::ostream::put(-0x80);
    std::ostream::flush();
LAB_0010d586:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"What cards would you like to exchange?",0x26);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
    std::ostream::put(-0x80);
    std::ostream::flush();
    pvVar4 = this->pCards->handPointer;
    ppCVar13 = (pointer)(pvVar4->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
                        super__Vector_impl_data._M_start;
    ppCVar20 = (pointer)(pvVar4->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
                        super__Vector_impl_data._M_finish;
    if (ppCVar13 == ppCVar20) {
      iVar11 = 0;
      iVar22 = 0;
      iVar23 = 0;
    }
    else {
      iVar23 = 0;
      iVar22 = 0;
      iVar11 = 0;
      do {
        CVar25 = *(CardType *)ppCVar13;
        if (CVar25 == INFANTRY) {
          iVar11 = iVar11 + 1;
        }
        else if (CVar25 == ARTILLERY) {
          iVar22 = iVar22 + 1;
        }
        else {
          if (CVar25 != CAVALRY) goto LAB_0010db70;
          iVar23 = iVar23 + 1;
        }
        ppCVar13 = (pointer)((long)ppCVar13 + 4);
      } while (ppCVar13 != ppCVar20);
    }
    local_64 = iVar10;
    local_54[0] = iVar11;
    local_54[1] = iVar22;
    local_54[2] = iVar23;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"You hand is: ",0xd);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
    std::ostream::put(-0x80);
    std::ostream::flush();
    poVar14 = (ostream *)std::ostream::operator<<(&std::cout,iVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14," infantry, ",0xb);
    poVar14 = (ostream *)std::ostream::operator<<(&std::cout,iVar22);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14," artillery, and ",0x10);
    poVar14 = (ostream *)std::ostream::operator<<(&std::cout,iVar23);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14," cavalry",8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
    std::ostream::put((char)poVar14);
    std::ostream::flush();
    local_98.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl.super__Vector_impl_data
    ._M_start = (pointer)0x0;
    local_98.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl.super__Vector_impl_data
    ._M_finish = (CardType *)0x0;
    local_98.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl.super__Vector_impl_data
    ._M_end_of_storage = (CardType *)0x0;
    iVar10 = 3;
LAB_0010d70a:
    if (0 < iVar10) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"You must pick ",0xe)
      ;
      poVar14 = (ostream *)std::ostream::operator<<(&std::cout,iVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14," more cards to exchange",0x17);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
      std::ostream::put((char)poVar14);
      std::ostream::flush();
      uVar21 = 0;
      local_70 = (pointer)0x0;
LAB_0010d77c:
      local_60 = (pointer)CONCAT44(local_60._4_4_,local_54[uVar21]);
      if (0 < local_54[uVar21]) {
        __s = "cavalry";
        if (uVar21 == 1) {
          __s = "artillery";
        }
        if (uVar21 == 0) {
          __s = "infantry";
        }
        iVar23 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"How many ",9);
          sVar15 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar15);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout," would you like to exchange?",0x1c);
          CVar25 = (CardType)uVar21;
          (*this->strategy->_vptr_PlayerStrategy[3])(this->strategy,uVar21 & 0xffffffff);
          iVar11 = (*this->strategy->_vptr_PlayerStrategy[1])(this->strategy,0xb);
          iVar22 = iVar10 - iVar11;
          if (iVar10 < iVar11) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"You can only exchange ",0x16);
            poVar14 = (ostream *)std::ostream::operator<<(&std::cout,iVar10);
            std::__ostream_insert<char,std::char_traits<char>>(poVar14," more cards",0xb);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
            std::ostream::put((char)poVar14);
            std::ostream::flush();
          }
          else if ((int)local_60 < iVar11) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "You cannot exchange more cards of a given type than you have in your hand.",
                       0x4a);
          }
          else {
            iVar26 = iVar11;
            if (0 < iVar11) {
              do {
                local_58 = CVar25;
                if (local_98.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl.
                    super__Vector_impl_data._M_finish ==
                    local_98.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<CardType,_std::allocator<CardType>_>::_M_realloc_insert<CardType>
                            (&local_98,
                             (iterator)
                             local_98.super__Vector_base<CardType,_std::allocator<CardType>_>.
                             _M_impl.super__Vector_impl_data._M_finish,&local_58);
                }
                else {
                  *local_98.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl.
                   super__Vector_impl_data._M_finish = CVar25;
                  local_98.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_98.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl.
                       super__Vector_impl_data._M_finish + 1;
                }
                iVar26 = iVar26 + -1;
                iVar10 = iVar22;
              } while (iVar26 != 0);
            }
          }
          if ((int)local_60 < iVar11) {
            if (iVar10 == 0) goto LAB_0010d91b;
          }
          else if ((iVar11 <= iVar10) || (iVar10 == 0)) break;
          iVar23 = iVar23 + 1;
          if (iVar23 == 10) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"An error occurred while exchanging your cards.",0x2e);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
            std::ostream::put(-0x80);
            std::ostream::flush();
            goto LAB_0010d98f;
          }
        } while( true );
      }
      goto LAB_0010d91e;
    }
    hand = this->pCards;
    pGVar16 = GameLoop::getInstance();
    iVar10 = local_64;
    deck = pGVar16->gameDeck;
    std::vector<CardType,_std::allocator<CardType>_>::vector(&local_48,&local_98);
    iVar23 = Hand::exchange(hand,deck,&local_48);
    if (local_48.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_48.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl
                            .super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl
                            .super__Vector_impl_data._M_start);
    }
    if (iVar23 == -1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"An error occurred while exchanging your cards.",0x2e);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
      std::ostream::put(-0x80);
      std::ostream::flush();
      bVar28 = false;
    }
    else {
      iVar10 = iVar10 + iVar23;
      bVar28 = true;
    }
    goto LAB_0010da4c;
  }
  if (pCVar24 == pCVar5) {
    iVar23 = 0;
    iVar22 = 0;
    iVar11 = 0;
  }
  else {
    iVar11 = 0;
    iVar22 = 0;
    iVar23 = 0;
    do {
      CVar25 = *pCVar24;
      if (CVar25 == CAVALRY) {
        iVar23 = iVar23 + 1;
      }
      else if (CVar25 == ARTILLERY) {
        iVar22 = iVar22 + 1;
      }
      else if (CVar25 == INFANTRY) {
        iVar11 = iVar11 + 1;
      }
      pCVar24 = pCVar24 + 1;
    } while (pCVar24 != pCVar5);
  }
  if (((iVar11 < 3 && iVar22 < 3) && iVar23 < 3) && (((iVar22 < 1 || (iVar11 < 1)) || (iVar23 < 1)))
     ) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"You don\'t have valid cards to exchange! Moving on...",0x34);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
    std::ostream::put(-0x80);
    std::ostream::flush();
  }
  else {
    while( true ) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Would you like to exchange cards? (Y/n)",0x27);
      uVar27 = (**this->strategy->_vptr_PlayerStrategy)(this->strategy,10);
      uVar19 = (uVar27 & 0xff) - 0x4e;
      if ((uVar19 < 0x2c) && ((0x80100000801U >> ((ulong)uVar19 & 0x3f) & 1) != 0)) break;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nInvalid Input. Please try again.",0x21);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
      std::ostream::put(-0x80);
      std::ostream::flush();
    }
    if (((byte)uVar27 & 0x5f) != 0x4e) goto LAB_0010d586;
  }
  if (-1 < iVar10) {
    uVar21 = (long)(this->pOwnedCountries->
                   super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->pOwnedCountries->
                   super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3;
    iVar23 = 3;
    if (8 < uVar21) {
      iVar23 = (int)uVar21 / 3;
    }
    iVar23 = iVar23 + iVar10;
    pGVar16 = GameLoop::getInstance();
    pvVar6 = pGVar16->gameMap->pMapContinents;
    ppCVar17 = (pvVar6->super__Vector_base<Map::Continent_*,_std::allocator<Map::Continent_*>_>).
               _M_impl.super__Vector_impl_data._M_start;
    ppCVar7 = (pvVar6->super__Vector_base<Map::Continent_*,_std::allocator<Map::Continent_*>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppCVar17 == ppCVar7) {
      iVar10 = 0;
    }
    else {
      iVar10 = 0;
      do {
        pvVar8 = (*ppCVar17)->pCountriesInContinent;
        ppCVar13 = (pvVar8->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                   _M_impl.super__Vector_impl_data._M_start;
        ppCVar20 = (pvVar8->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
        if (ppCVar13 != ppCVar20) {
          do {
            if (*this->pPlayerId != *(*ppCVar13)->pPlayerOwnerId) goto LAB_0010db65;
            ppCVar13 = ppCVar13 + 1;
          } while (ppCVar13 != ppCVar20);
        }
        iVar10 = iVar10 + *(*ppCVar17)->pCTroops;
LAB_0010db65:
        ppCVar17 = ppCVar17 + 1;
      } while (ppCVar17 != ppCVar7);
    }
    (*this->strategy->_vptr_PlayerStrategy[2])(this->strategy,(ulong)(uint)(iVar23 + iVar10));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Place your armies:",0x12);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
    std::ostream::put(-0x80);
    std::ostream::flush();
    uVar27 = iVar23 + iVar10;
    if (uVar27 == 0 || SCARRY4(iVar23,iVar10) != (int)uVar27 < 0) {
LAB_0010de6b:
      operator_delete(this->currentState,4);
      pPVar12 = (PlayerState *)operator_new(4);
      *pPVar12 = IDLE;
      this->currentState = pPVar12;
      (*this->strategy->_vptr_PlayerStrategy[5])();
      return 1;
    }
    do {
      do {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Troops remaining: ",0x12);
        plVar18 = (long *)std::ostream::operator<<(&std::cout,uVar27);
        std::ios::widen((char)*(undefined8 *)(*plVar18 + -0x18) + (char)plVar18);
        std::ostream::put((char)plVar18);
        std::ostream::flush();
        ppCVar13 = (this->pOwnedCountries->
                   super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        local_70 = (this->pOwnedCountries->
                   super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
        uVar19 = uVar27;
      } while (ppCVar13 == local_70);
      do {
        pCVar9 = *ppCVar13;
        local_98.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_98.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
        pcVar3 = (pCVar9->cyName->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_98,pcVar3,pcVar3 + pCVar9->cyName->_M_string_length);
        poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,
                             (char *)local_98.
                                     super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl
                                     .super__Vector_impl_data._M_start,
                             (long)local_98.super__Vector_base<CardType,_std::allocator<CardType>_>.
                                   _M_impl.super__Vector_impl_data._M_finish);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14," has ",5);
        poVar14 = (ostream *)std::ostream::operator<<(poVar14,*pCVar9->pNumberOfTroops);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14," armies. Add how many? ",0x17);
        if ((pointer *)
            local_98.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl.
            super__Vector_impl_data._M_start !=
            &local_98.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage) {
          operator_delete(local_98.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (ulong)((long)local_98.
                                        super__Vector_base<CardType,_std::allocator<CardType>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
        }
        do {
          local_60 = ppCVar13;
          (*this->strategy->_vptr_PlayerStrategy[4])(this->strategy,pCVar9);
          (*this->strategy->_vptr_PlayerStrategy[2])(this->strategy,(ulong)uVar19);
          iVar10 = (*this->strategy->_vptr_PlayerStrategy[1])(this->strategy,0xc);
          uVar27 = *(uint *)(secure_getenv + *(long *)(std::cin + -0x18));
          if (((uVar27 & 5) != 0) || ((int)uVar19 < iVar10 || iVar10 < 0)) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Invalid value entered. Pleased try again.",0x29);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
            std::ostream::put(-0x80);
            std::ostream::flush();
            uVar27 = *(uint *)(secure_getenv + *(long *)(std::cin + -0x18));
          }
          ppCVar13 = local_60;
        } while (((uVar27 & 5) != 0) || (iVar10 < 0 || (int)uVar19 < iVar10));
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
        std::ostream::put(-0x80);
        std::ostream::flush();
        *pCVar9->pNumberOfTroops = *pCVar9->pNumberOfTroops + iVar10;
        uVar27 = uVar19 - iVar10;
        if (uVar27 == 0 || (int)uVar19 < iVar10) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"\nYou\'ve placed all your armies!",0x1f);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
          std::ostream::put(-0x80);
          std::ostream::flush();
          goto LAB_0010de6b;
        }
        ppCVar13 = local_60 + 1;
        uVar19 = uVar27;
      } while (ppCVar13 != local_70);
    } while( true );
  }
  goto LAB_0010db70;
LAB_0010d91b:
  iVar10 = 0;
LAB_0010d91e:
  bVar28 = 1 < uVar21;
  uVar21 = uVar21 + 1;
  ppCVar20 = (pointer)CONCAT71((int7)((ulong)ppCVar20 >> 8),bVar28);
  local_70 = ppCVar20;
  if (uVar21 == 3) goto code_r0x0010d93c;
  goto LAB_0010d77c;
code_r0x0010d93c:
  local_70 = (pointer)0x1;
LAB_0010d98f:
  if (((ulong)local_70 & 1) == 0) goto code_r0x0010d99a;
  goto LAB_0010d70a;
code_r0x0010d99a:
  bVar28 = false;
  iVar10 = local_64;
LAB_0010da4c:
  if ((pointer *)
      local_98.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer *)0x0) {
    operator_delete(local_98.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (!bVar28) {
LAB_0010db70:
    operator_delete(this->currentState,4);
    pPVar12 = (PlayerState *)operator_new(4);
    *pPVar12 = IDLE;
    this->currentState = pPVar12;
    (*this->strategy->_vptr_PlayerStrategy[5])();
    return -1;
  }
  goto LAB_0010d436;
}

Assistant:

int Player::reinforce() {
    /* Act of collecting new armies and placing them on the map
     * 0. At the start of your turn, if you have 5+ cards, player must trade at least 1 set.
     * 1. Trade valid sets of cards to receive armies
     * 2. Place received armies on the map
     */
    auto cardExchange = [](Player &player) {
        auto output = 0;

        while (true) {
            if (player.getCards()->getHand()->size() > 5) {
                std::cout << "You have more than 5 cards in your hand, so you must exchange at least once" << std::endl;
            } else if (canExchange(*player.getCards()->getHand())) {
                char input = 0;
                do {
                    std::cout << "Would you like to exchange cards? (Y/n)";
                    input = player.strategy->yesOrNo(StrategyContext::REINFORCE);
                    if (input != 'y' && input != 'n' && input != 'Y' && input != 'N') {
                        std::cout << "\nInvalid Input. Please try again." << std::endl;
                    }
                } while (input != 'y' && input != 'n' && input != 'Y' && input != 'N');
                if (input == 'n' || input == 'N') {
                    return output;
                }
            } else {
                std::cout << "You don't have valid cards to exchange! Moving on..." << std::endl;
                return output;
            }
            std::cout << "What cards would you like to exchange?" << std::endl;
            int types[3] = {};
            types[0] = 0, types[1] = 0, types[2] = 0;
            for (auto card : *player.getCards()->getHand()) {
                switch (card) {
                    case CardType::INFANTRY:
                        types[0]++;
                        break;
                    case CardType::ARTILLERY:
                        types[1]++;
                        break;
                    case CardType::CAVALRY:
                        types[2]++;
                        break;
                    default: {
                        return -1;
                    }
                }
            }

            std::cout << "You hand is: " << std::endl;
            std::cout << types[0] << " infantry, ";
            std::cout << types[1] << " artillery, and ";
            std::cout << types[2] << " cavalry" << std::endl;

            auto cardsToExchange = std::vector<CardType>();
            auto remaining = 3;

            while (remaining > 0) {
                std::cout << "You must pick " << remaining << " more cards to exchange" << std::endl;
                for (auto i = 0; i <= 2; i++) {
                    if (types[i] > 0) {
                        auto input = 0;
                        int failsafeCounter = 0;
                        do {
                            //avoid infinite loops in case of bot malfunction or human delaying the game
                            if(failsafeCounter >= 10){
                                std::cout << "An error occurred while exchanging your cards." << std::endl;
                                return -1;
                            }
                            failsafeCounter++;
                            std::cout << "How many " << (i == 0 ? "infantry" : i == 1 ? "artillery" : "cavalry");
                            std::cout << " would you like to exchange?";
                            player.strategy->setExchangingCardType(i);
                            input = player.strategy->intInput(StrategyContext::REINFORCE_CARD_COUNT);
                            if (input > remaining) {
                                std::cout << "You can only exchange " << remaining << " more cards" << std::endl;
                            } else if (input > types[i]) {
                                std::cout
                                        << "You cannot exchange more cards of a given type than you have in your hand.";
                            } else {
                                for (auto j = 0; j < input; j++, remaining--) {
                                    cardsToExchange.push_back((CardType) i);
                                }

                            }
                        } while ((input > types[i] || input > remaining) && remaining != 0);
                    }
                }
            }
            auto out = Hand::exchange(player.getCards(), GameLoop::getInstance()->getGameDeck(), cardsToExchange);
            if (out == -1) {
                std::cout << "An error occurred while exchanging your cards." << std::endl;
                return -1;
            } else {
                output += out;
            }
        }
    };

    auto countriesOwned = [](Player& player) {
        auto countries = player.getOwnedCountries()->size();

        return countries < 9 ? 3 : (int) countries / 3;
    };

    auto continentControlValue = [](const Player &player) {
        auto value = 0;
        for (auto *cont : *GameLoop::getInstance()->getGameMap()->getMapContinents()) {
            auto fullControl = true;

            for (auto *country : *cont->getCountriesInContinent()) {
                if (player.getPlayerId() != country->getPlayerOwnerID()) {
                    fullControl = false;
                    break;
                }
            }

            if (fullControl) {
                value += cont->getpCTroops();
            }
        }

        return value;
    };

    this->setPlayerState(PlayerState::REINFORCING);
    this->notifyAll();

    if ( this->getStrategy()->getStrategyName() == "CHEATER") {
        return (PlayerAction) this->getStrategy()->yesOrNo(StrategyContext::REINFORCE);
    }

    auto exchange = cardExchange(*this);
    if (exchange < 0) {
        this->setPlayerState(PlayerState::IDLE);
        this->strategy->resetChoices();
        return PlayerAction::FAILED;
    }

    auto newArmies = exchange + countriesOwned(*this) + continentControlValue(*this);
    strategy->setArmiesToPlace(newArmies);

    std::cout << "Place your armies:" << std::endl;

    int troops, place = 0;
    while (newArmies > 0) {
        std::cout << "Troops remaining: " << newArmies << std::endl;
        for (auto *country : *this->getOwnedCountries()) {
            std::cout << country->getCountryName() << " has " << country->getNumberOfTroops() << " armies. Add how many? ";
            do {
                strategy->setTo(country);
                strategy->setArmiesToPlace(newArmies);
                place = strategy->intInput(StrategyContext::REINFORCE_ARMY_COUNT);
                if(cin.fail() || place > newArmies || place < 0 || isnan(place)) {
                    std::cout << "Invalid value entered. Pleased try again." << std::endl;
                }
            } while (cin.fail() || place > newArmies || place < 0 || isnan(place));
            std::cout << std::endl;
            troops = country->getNumberOfTroops();
            country->setNumberOfTroops(troops + place);
            newArmies -= place;
            if (newArmies <= 0) {
                std::cout << "\nYou've placed all your armies!" << std::endl;
                break;
            }
        }
    }
    this->setPlayerState(PlayerState::IDLE);
    this->strategy->resetChoices();
    return PlayerAction::SUCCEEDED;
}